

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

void __thiscall NanoVM::NanoVM(NanoVM *this,uchar *code,uint64_t size)

{
  uchar *puVar1;
  uint64_t size_local;
  uchar *code_local;
  NanoVM *this_local;
  
  (this->cpu).bytecodeSize = size;
  memset(&this->cpu,0,0x78);
  memset(&this->cpu,0,0x50);
  (this->cpu).codeSize = ((size >> 0xc) + 1) * 0x1000;
  (this->cpu).stackSize = 0x1000;
  puVar1 = (uchar *)malloc((this->cpu).stackSize + 10 + (this->cpu).codeSize);
  (this->cpu).codeBase = puVar1;
  (this->cpu).stackBase = (this->cpu).codeBase + (this->cpu).codeSize;
  memset((this->cpu).stackBase,0,0x12);
  memcpy((this->cpu).codeBase,code,size);
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[7] = (this->cpu).codeSize;
  (this->cpu).registers[6] = (this->cpu).codeSize;
  return;
}

Assistant:

NanoVM::NanoVM(unsigned char* code, uint64_t size) {
	cpu.bytecodeSize = size;
	// Initialize cpu
	memset(&cpu, 0x00, sizeof(cpu));
	// Zero out registers
	memset(cpu.registers, 0x00, sizeof(cpu.registers));
	cpu.codeSize = (NANOVM_PAGE_SIZE * (1 + (size / NANOVM_PAGE_SIZE)));
	cpu.stackSize = NANOVM_PAGE_SIZE;
	// allocate whole memory, code pages, stack, +10 bytes
	// +10 bytes is for instruction fetching which might read more bytes than the instruction size
	// This avoids reading memory out side of the VM
	cpu.codeBase = (unsigned char*) malloc(cpu.stackSize + 10 + cpu.codeSize);
	// Set stack base. Stack grows up instead of down like in x86
	cpu.stackBase = cpu.codeBase + cpu.codeSize;
	// Zero out stack + the last 10 bytes
	memset(cpu.stackBase, 0x00, sizeof(cpu.stackSize) + 10);
	// copy the bytecode to the vm
	memcpy(cpu.codeBase, code, size);
	// Set IP to the beginning of code
	cpu.registers[ip] = 0;
	cpu.registers[esp] = cpu.codeSize;
	cpu.registers[bp] = cpu.codeSize;
}